

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::DuplicateRowsPS::DuplicateRowsPS
          (DuplicateRowsPS *this,SPxLPBase<double> *lp,int _i,int maxLhsIdx,int minRhsIdx,
          DSVectorBase<double> *dupRows,Array<double> *scale,DataArray<int> *perm,
          DataArray<bool> *isLhsEqualRhs,bool isTheLast,bool isFixedRow,
          shared_ptr<soplex::Tolerances> *tols,bool isFirst)

{
  int **p;
  int iVar1;
  SPxSense SVar2;
  element_type *peVar3;
  Nonzero<double> *pNVar4;
  int iVar5;
  int n;
  long lVar6;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar3 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar5 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069e680;
  (this->super_PostStep).m_name = "DuplicateRows";
  (this->super_PostStep).nCols = iVar5;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_0069ef30;
  this->m_i = _i;
  SVar2 = lp->thesense;
  dVar8 = (lp->super_LPRowSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[_i];
  if (SVar2 == MINIMIZE) {
    dVar8 = -dVar8;
  }
  this->m_i_rowObj = dVar8;
  this->m_maxLhsIdx = maxLhsIdx;
  this->m_minRhsIdx = minRhsIdx;
  this->m_maxSense = SVar2 == MAXIMIZE;
  this->m_isFirst = isFirst;
  this->m_isLast = isTheLast;
  this->m_fixed = isFixedRow;
  this->m_nCols = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar1 = (dupRows->super_SVectorBase<double>).memused;
  (this->m_scale).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_scale).super_SVectorBase<double>.memsize = 0;
  (this->m_scale).super_SVectorBase<double>.memused = 0;
  (this->m_scale)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
  (this->m_scale).theelem = (Nonzero<double> *)0x0;
  if (iVar1 < 1) {
    iVar1 = 2;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_scale).theelem,iVar1);
  (this->m_scale).super_SVectorBase<double>.m_elem = (this->m_scale).theelem;
  (this->m_scale).super_SVectorBase<double>.memused = 0;
  (this->m_scale).super_SVectorBase<double>.memsize = iVar1;
  iVar1 = (dupRows->super_SVectorBase<double>).memused;
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (Nonzero<double> *)0x0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = 0;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_0069e2b8;
  (this->m_rowObj).theelem = (Nonzero<double> *)0x0;
  iVar5 = 2;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  spx_alloc<soplex::Nonzero<double>*>(&(this->m_rowObj).theelem,iVar5);
  (this->m_rowObj).super_SVectorBase<double>.m_elem = (this->m_rowObj).theelem;
  (this->m_rowObj).super_SVectorBase<double>.memused = 0;
  (this->m_rowObj).super_SVectorBase<double>.memsize = iVar5;
  iVar1 = (dupRows->super_SVectorBase<double>).memused;
  p = &(this->m_rIdxLocalOld).data;
  (this->m_rIdxLocalOld).data = (int *)0x0;
  (this->m_rIdxLocalOld).memFactor = 1.2;
  iVar5 = 0;
  if (0 < iVar1) {
    iVar5 = iVar1;
  }
  (this->m_rIdxLocalOld).thesize = iVar5;
  n = 1;
  if (0 < iVar1) {
    n = iVar5;
  }
  (this->m_rIdxLocalOld).themax = n;
  spx_alloc<int*>(p,n);
  DataArray<int>::DataArray(&this->m_perm,perm);
  DataArray<bool>::DataArray(&this->m_isLhsEqualRhs,isLhsEqualRhs);
  if (0 < (dupRows->super_SVectorBase<double>).memused) {
    dVar8 = (scale->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[_i];
    pNVar4 = (dupRows->super_SVectorBase<double>).m_elem;
    lVar6 = 8;
    lVar7 = 0;
    do {
      iVar1 = *(int *)((long)&pNVar4->val + lVar6);
      dVar9 = dVar8 / (scale->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar1];
      DSVectorBase<double>::makeMem(&this->m_scale,1);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        iVar5 = (this->m_scale).super_SVectorBase<double>.memused;
        pNVar4 = (this->m_scale).super_SVectorBase<double>.m_elem;
        pNVar4[iVar5].idx = iVar1;
        pNVar4[iVar5].val = dVar9;
        (this->m_scale).super_SVectorBase<double>.memused = iVar5 + 1;
      }
      iVar1 = *(int *)((long)&((dupRows->super_SVectorBase<double>).m_elem)->val + lVar6);
      dVar9 = (lp->super_LPRowSetBase<double>).object.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[iVar1];
      dVar10 = dVar9;
      if (lp->thesense == MINIMIZE) {
        dVar10 = -dVar9;
      }
      DSVectorBase<double>::makeMem(&this->m_rowObj,1);
      if ((dVar9 != 0.0) || (NAN(dVar9))) {
        iVar5 = (this->m_rowObj).super_SVectorBase<double>.memused;
        pNVar4 = (this->m_rowObj).super_SVectorBase<double>.m_elem;
        pNVar4[iVar5].idx = iVar1;
        pNVar4[iVar5].val = dVar10;
        (this->m_rowObj).super_SVectorBase<double>.memused = iVar5 + 1;
      }
      pNVar4 = (dupRows->super_SVectorBase<double>).m_elem;
      (*p)[lVar7] = *(int *)((long)&pNVar4->val + lVar6);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar7 < (dupRows->super_SVectorBase<double>).memused);
  }
  return;
}

Assistant:

DuplicateRowsPS(const SPxLPBase<R>& lp, int _i,
                      int maxLhsIdx, int minRhsIdx, const DSVectorBase<R>& dupRows,
                      const Array<R> scale, const DataArray<int> perm, const DataArray<bool> isLhsEqualRhs,
                      bool isTheLast, bool isFixedRow, std::shared_ptr<Tolerances> tols, bool isFirst = false)
         : PostStep("DuplicateRows", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_i_rowObj(lp.rowObj(_i))
         , m_maxLhsIdx((maxLhsIdx == -1) ? -1 : maxLhsIdx)
         , m_minRhsIdx((minRhsIdx == -1) ? -1 : minRhsIdx)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_isFirst(isFirst)
         , m_isLast(isTheLast)
         , m_fixed(isFixedRow)
         , m_nCols(lp.nCols())
         , m_scale(dupRows.size())
         , m_rowObj(dupRows.size())
         , m_rIdxLocalOld(dupRows.size())
         , m_perm(perm)
         , m_isLhsEqualRhs(isLhsEqualRhs)
      {
         R rowScale = scale[_i];

         for(int k = 0; k < dupRows.size(); ++k)
         {
            m_scale.add(dupRows.index(k), rowScale / scale[dupRows.index(k)]);
            m_rowObj.add(dupRows.index(k), lp.rowObj(dupRows.index(k)));
            m_rIdxLocalOld[k] = dupRows.index(k);
         }
      }